

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pshrec.c
# Opt level: O0

void t2_hints_funcs_init(T2_Hints_FuncsRec *funcs)

{
  T2_Hints_FuncsRec *funcs_local;
  
  memset(funcs,0,0x38);
  funcs->open = t2_hints_open;
  funcs->close = ps_hints_close;
  funcs->stems = t2_hints_stems;
  funcs->hintmask = ps_hints_t2mask;
  funcs->counter = ps_hints_t2counter;
  funcs->apply = ps_hints_apply;
  return;
}

Assistant:

FT_LOCAL_DEF( void )
  t2_hints_funcs_init( T2_Hints_FuncsRec*  funcs )
  {
    FT_ZERO( funcs );

    funcs->open    = (T2_Hints_OpenFunc)   t2_hints_open;
    funcs->close   = (T2_Hints_CloseFunc)  ps_hints_close;
    funcs->stems   = (T2_Hints_StemsFunc)  t2_hints_stems;
    funcs->hintmask= (T2_Hints_MaskFunc)   ps_hints_t2mask;
    funcs->counter = (T2_Hints_CounterFunc)ps_hints_t2counter;
    funcs->apply   = (T2_Hints_ApplyFunc)  ps_hints_apply;
  }